

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

void lys_disable_deviations(lys_module *module)

{
  lys_submodule *plVar1;
  unres_schema *puVar2;
  size_t sVar3;
  uint uVar4;
  bool bVar5;
  unres_schema *local_30;
  unres_schema *unres;
  char *ptr;
  lys_module *mod;
  uint32_t j;
  uint32_t i;
  lys_module *module_local;
  
  if ((*(ushort *)&module->field_0x40 >> 4 & 3) != 0) {
    _j = module;
    local_30 = (unres_schema *)calloc(1,0x28);
    if (local_30 == (unres_schema *)0x0) {
      ly_log(_j->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_disable_deviations");
    }
    else {
      mod._4_4_ = (_j->ctx->models).used;
      while (uVar4 = mod._4_4_ - 1, mod._4_4_ != 0) {
        ptr = (char *)(_j->ctx->models).list[uVar4];
        mod._4_4_ = uVar4;
        if ((lys_module *)ptr != _j) {
          mod._0_4_ = (uint)((lys_module *)ptr)->deviation_size;
          while (uVar4 = (uint)mod - 1, bVar5 = (uint)mod != 0, mod._0_4_ = uVar4, bVar5) {
            puVar2 = (unres_schema *)
                     strstr(*(char **)(*(long *)(ptr + 0x90) + (ulong)uVar4 * 0x38),_j->name);
            unres = puVar2;
            if ((puVar2 != (unres_schema *)0x0) &&
               (sVar3 = strlen(_j->name), *(char *)((long)&puVar2->item + sVar3) == ':')) {
              lys_switch_deviation
                        ((lys_deviation *)(*(long *)(ptr + 0x90) + (ulong)(uint)mod * 0x38),
                         (lys_module *)ptr,local_30);
            }
          }
        }
      }
      if (((byte)(*(ushort *)&_j->field_0x40 >> 4) & 3) != 1) {
        mod._4_4_ = uVar4;
        __assert_fail("module->deviated == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
                      ,0x1232,"void lys_disable_deviations(struct lys_module *)");
      }
      *(ushort *)&_j->field_0x40 = *(ushort *)&_j->field_0x40 & 0xffcf | 0x20;
      for (mod._0_4_ = 0; (uint)mod < _j->inc_size; mod._0_4_ = (uint)mod + 1) {
        if (((byte)(_j->inc[(uint)mod].submodule)->field_0x40 >> 4 & 3) != 0) {
          plVar1 = _j->inc[(uint)mod].submodule;
          plVar1->field_0x40 =
               plVar1->field_0x40 & 0xcf | ((byte)(*(ushort *)&_j->field_0x40 >> 4) & 3) << 4;
        }
      }
      mod._4_4_ = uVar4;
      if (local_30->count != 0) {
        resolve_unres_schema(_j,local_30);
      }
      unres_schema_free(_j,&local_30,1);
    }
  }
  return;
}

Assistant:

void
lys_disable_deviations(struct lys_module *module)
{
    uint32_t i, j;
    const struct lys_module *mod;
    const char *ptr;
    struct unres_schema *unres;

    if (module->deviated) {
        unres = calloc(1, sizeof *unres);
        LY_CHECK_ERR_RETURN(!unres, LOGMEM(module->ctx), );

        i = module->ctx->models.used;
        while (i--) {
            mod = module->ctx->models.list[i];

            if (mod == module) {
                continue;
            }

            j = mod->deviation_size;
            while (j--) {
                ptr = strstr(mod->deviation[j].target_name, module->name);
                if (ptr && ptr[strlen(module->name)] == ':') {
                    lys_switch_deviation(&mod->deviation[j], mod, unres);
                }
            }
        }

        assert(module->deviated == 1);
        module->deviated = 2;

        for (j = 0; j < module->inc_size; j++) {
            if (module->inc[j].submodule->deviated) {
                module->inc[j].submodule->deviated = module->deviated;
            }
        }

        if (unres->count) {
            resolve_unres_schema(module, unres);
        }
        unres_schema_free(module, &unres, 1);
    }
}